

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::InstanceSymbol::connectDefaultIfacePorts(InstanceSymbol *this)

{
  pointer ppSVar1;
  char *pcVar2;
  undefined4 uVar3;
  InstanceBodySymbol *pIVar4;
  size_t sVar5;
  InterfacePortSymbol *this_00;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
  *arrays_;
  undefined1 auVar6 [16];
  DeferredSourceRange sourceRange;
  int iVar7;
  InstanceArraySymbol *pIVar8;
  ulong pos0;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  uint uVar9;
  Compilation *args;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong hash;
  pointer ppSVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  InstanceSymbol *firstInst;
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> dims;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> conns;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  Compilation *local_128;
  SourceLocation local_120;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_118;
  _Storage<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true> local_100;
  char local_f0;
  Scope *local_e8;
  long local_e0;
  ConstantRange local_d8;
  SourceLocation local_d0;
  SourceLocation SStack_c8;
  undefined8 local_c0;
  SmallVectorBase<const_slang::ast::PortConnection_*> local_b8 [2];
  char local_78;
  char cStack_77;
  char cStack_76;
  byte bStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  byte bStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  byte bStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  byte bStack_69;
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  AssertionInstanceDetails *local_38;
  
  local_e8 = (this->super_InstanceSymbolBase).super_Symbol.parentScope;
  args = local_e8->compilation;
  local_68._8_4_ = 0xffffffff;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_38 = (AssertionInstanceDetails *)0x0;
  local_b8[0].data_ = (pointer)local_b8[0].firstElement;
  local_b8[0].len = 0;
  local_b8[0].cap = 5;
  pIVar4 = this->body;
  local_68._0_8_ = local_e8;
  if ((pIVar4->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&pIVar4->super_Scope);
    in_RDX = extraout_RDX;
  }
  sVar5 = (pIVar4->portList)._M_extent._M_extent_value;
  if (sVar5 != 0) {
    ppSVar13 = (pIVar4->portList)._M_ptr;
    ppSVar1 = ppSVar13 + sVar5;
    local_128 = args;
    do {
      this_00 = (InterfacePortSymbol *)*ppSVar13;
      if (((this_00->super_Symbol).kind == InterfacePort) &&
         (this_00->interfaceDef != (DefinitionSymbol *)0x0)) {
        InterfacePortSymbol::getDeclaredRange
                  ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                   &local_100._M_value,this_00);
        if (local_f0 == '\x01') {
          local_138._M_len = 0;
          pIVar8 = (InstanceArraySymbol *)
                   recurseDefaultIfaceInst
                             (args,this_00,(InstanceSymbol **)&local_138,
                              (iterator)local_100._M_value._M_ptr,
                              local_100._M_value._M_ptr +
                              (long)local_100._M_value._M_extent._M_extent_value);
          if ((InstanceSymbol *)local_138._M_len == (InstanceSymbol *)0x0) goto LAB_002382b1;
          local_d0 = (this_00->super_Symbol).location;
          SStack_c8 = (SourceLocation)
                      ((this_00->super_Symbol).name._M_len * 0x10000000 + (long)local_d0);
          local_c0 = 1;
          sourceRange.range.endLoc = SStack_c8;
          sourceRange.range.startLoc = local_d0;
          sourceRange.node.value = 1;
          local_100._M_value._M_extent._M_extent_value =
               (__extent_storage<18446744073709551615UL>)
               InterfacePortSymbol::getModport
                         (this_00,(ASTContext *)local_68,(InstanceSymbol *)local_138._M_len,
                          sourceRange);
        }
        else {
          local_138._M_len = (this_00->super_Symbol).name._M_len;
          local_138._M_str = (this_00->super_Symbol).name._M_str;
          local_120 = (this_00->super_Symbol).location;
          local_118._M_ptr = (pointer)0x0;
          local_118._M_extent._M_extent_value = 0;
          local_d8.left = 0;
          local_d8.right = 0;
          pIVar8 = BumpAllocator::
                   emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>,slang::ConstantRange>
                             (&args->super_BumpAllocator,args,&local_138,&local_120,&local_118,
                              &local_d8);
LAB_002382b1:
          local_100._M_value._M_extent._M_extent_value =
               (__extent_storage<18446744073709551615UL>)(ModportSymbol *)0x0;
        }
        (pIVar8->super_Symbol).parentScope = local_e8;
        local_118._M_ptr = (pointer)0x0;
        local_100._M_value._M_ptr = (pointer)pIVar8;
        local_138._M_len =
             (size_t)BumpAllocator::
                     emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&,std::pair<slang::ast::Symbol*,slang::ast::ModportSymbol_const*>,decltype(nullptr)>
                               (&args->super_BumpAllocator,this_00,
                                (pair<slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
                                &local_100._M_value,&local_118._M_ptr);
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection*>
                  ((SmallVectorBase<slang::ast::PortConnection_const*> *)local_b8,
                   (PortConnection **)&local_138);
        arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                   *)this->connectionMap;
        local_118._M_ptr = *(pointer *)((long)local_b8[0].data_ + (local_b8[0].len - 1) * 8);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = this_00;
        hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        pos0 = hash >> ((byte)*arrays_ & 0x3f);
        local_e0 = *(long *)(arrays_ + 0x10);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        in_RDX = (EVP_PKEY_CTX *)(ulong)((uint)hash & 7);
        uVar12 = 0;
        uVar11 = pos0;
        do {
          pcVar2 = (char *)(local_e0 + uVar11 * 0x10);
          local_78 = *pcVar2;
          cStack_77 = pcVar2[1];
          cStack_76 = pcVar2[2];
          bStack_75 = pcVar2[3];
          cStack_74 = pcVar2[4];
          cStack_73 = pcVar2[5];
          cStack_72 = pcVar2[6];
          bStack_71 = pcVar2[7];
          cStack_70 = pcVar2[8];
          cStack_6f = pcVar2[9];
          cStack_6e = pcVar2[10];
          bStack_6d = pcVar2[0xb];
          cStack_6c = pcVar2[0xc];
          cStack_6b = pcVar2[0xd];
          cStack_6a = pcVar2[0xe];
          bStack_69 = pcVar2[0xf];
          cVar14 = (char)uVar3;
          auVar18[0] = -(local_78 == cVar14);
          cVar15 = (char)((uint)uVar3 >> 8);
          auVar18[1] = -(cStack_77 == cVar15);
          cVar16 = (char)((uint)uVar3 >> 0x10);
          auVar18[2] = -(cStack_76 == cVar16);
          bVar17 = (byte)((uint)uVar3 >> 0x18);
          auVar18[3] = -(bStack_75 == bVar17);
          auVar18[4] = -(cStack_74 == cVar14);
          auVar18[5] = -(cStack_73 == cVar15);
          auVar18[6] = -(cStack_72 == cVar16);
          auVar18[7] = -(bStack_71 == bVar17);
          auVar18[8] = -(cStack_70 == cVar14);
          auVar18[9] = -(cStack_6f == cVar15);
          auVar18[10] = -(cStack_6e == cVar16);
          auVar18[0xb] = -(bStack_6d == bVar17);
          auVar18[0xc] = -(cStack_6c == cVar14);
          auVar18[0xd] = -(cStack_6b == cVar15);
          auVar18[0xe] = -(cStack_6a == cVar16);
          auVar18[0xf] = -(bStack_69 == bVar17);
          uVar9 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
          local_138._M_len = (size_t)this_00;
          if (uVar9 != 0) {
            do {
              iVar7 = 0;
              if (uVar9 != 0) {
                for (; (uVar9 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                }
              }
              args = local_128;
              if (*(InterfacePortSymbol **)
                   (*(long *)(arrays_ + 0x18) + uVar11 * 0xf0 + (ulong)(uint)(iVar7 << 4)) ==
                  this_00) goto LAB_0023844d;
              uVar9 = uVar9 - 1 & uVar9;
            } while (uVar9 != 0);
          }
          if (((byte)in_RDX[0x48f980] & bStack_69) == 0) break;
          lVar10 = uVar11 + uVar12;
          uVar12 = uVar12 + 1;
          uVar11 = lVar10 + 1U & *(ulong *)(arrays_ + 8);
        } while (uVar12 <= *(ulong *)(arrays_ + 8));
        if (*(ulong *)(arrays_ + 0x28) < *(ulong *)(arrays_ + 0x20)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    ((locator *)&local_100._M_value,arrays_,(arrays_type *)arrays_,pos0,hash,
                     (try_emplace_args_t *)&local_120,&local_138._M_len,(unsigned_long *)&local_118)
          ;
          *(long *)(arrays_ + 0x28) = *(long *)(arrays_ + 0x28) + 1;
          in_RDX = extraout_RDX_00;
          args = local_128;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    ((locator *)&local_100._M_value,arrays_,hash,(try_emplace_args_t *)&local_120,
                     &local_138._M_len,(unsigned_long *)&local_118);
          in_RDX = extraout_RDX_01;
          args = local_128;
        }
      }
LAB_0023844d:
      ppSVar13 = ppSVar13 + 1;
    } while (ppSVar13 != ppSVar1);
  }
  iVar7 = SmallVectorBase<const_slang::ast::PortConnection_*>::copy
                    (local_b8,(EVP_PKEY_CTX *)args,in_RDX);
  (this->connections)._M_ptr = (pointer)CONCAT44(extraout_var,iVar7);
  (this->connections)._M_extent._M_extent_value = extraout_RDX_02;
  if (local_b8[0].data_ != (pointer)local_b8[0].firstElement) {
    operator_delete(local_b8[0].data_);
  }
  return;
}

Assistant:

void InstanceSymbol::connectDefaultIfacePorts() const {
    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    auto& comp = parent->getCompilation();
    ASTContext context(*parent, LookupLocation::max);

    SmallVector<const PortConnection*> conns;
    for (auto port : body.getPortList()) {
        if (port->kind == SymbolKind::InterfacePort) {
            auto& ifacePort = port->as<InterfacePortSymbol>();
            if (ifacePort.interfaceDef) {
                Symbol* inst;
                const ModportSymbol* modport = nullptr;
                if (auto dims = ifacePort.getDeclaredRange()) {
                    const InstanceSymbol* firstInst = nullptr;
                    inst = recurseDefaultIfaceInst(comp, ifacePort, firstInst, dims->begin(),
                                                   dims->end());

                    if (firstInst) {
                        auto portRange = SourceRange{port->location,
                                                     port->location + port->name.length()};
                        modport = ifacePort.getModport(context, *firstInst, portRange);
                    }
                }
                else {
                    inst = &InstanceArraySymbol::createEmpty(comp, port->name, port->location);
                }

                inst->setParent(*parent);
                conns.emplace_back(
                    comp.emplace<PortConnection>(ifacePort, std::pair{inst, modport}, nullptr));
                connectionMap->emplace(reinterpret_cast<uintptr_t>(port),
                                       reinterpret_cast<uintptr_t>(conns.back()));
            }
        }
    }
    connections = conns.copy(comp);
}